

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::decompress
               (PixelBufferAccess *dst,deUint8 *data,bool isSRGB,bool isLDR)

{
  int iVar1;
  int iVar2;
  int blockWidth_00;
  int blockHeight_00;
  void *local_970;
  Vector<float,_4> local_968;
  int local_958;
  int local_954;
  int j_1;
  int i_1;
  int local_940;
  int local_93c;
  int j;
  int i;
  Block128 blockData;
  anon_union_2304_2_1776bc36 decompressedBuffer;
  int blockHeight;
  int blockWidth;
  bool isLDR_local;
  bool isSRGB_local;
  deUint8 *data_local;
  PixelBufferAccess *dst_local;
  
  iVar1 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  iVar2 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  Block128::Block128((Block128 *)&j,data);
  local_970 = (void *)((long)blockData.m_words + 0xc);
  blockWidth_00 = ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  blockHeight_00 = ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  decompressBlock(local_970,(Block128 *)&j,blockWidth_00,blockHeight_00,isSRGB,isLDR);
  if (isSRGB) {
    for (local_93c = 0; local_93c < iVar2; local_93c = local_93c + 1) {
      for (local_940 = 0; local_940 < iVar1; local_940 = local_940 + 1) {
        Vector<int,_4>::Vector
                  ((Vector<int,_4> *)&j_1,
                   (uint)*(byte *)((long)blockData.m_words +
                                  (long)((local_93c * iVar1 + local_940) * 4) + 0xc),
                   (uint)*(byte *)((long)blockData.m_words +
                                  (long)((local_93c * iVar1 + local_940) * 4 + 1) + 0xc),
                   (uint)*(byte *)((long)blockData.m_words +
                                  (long)((local_93c * iVar1 + local_940) * 4 + 2) + 0xc),
                   (uint)*(byte *)((long)blockData.m_words +
                                  (long)((local_93c * iVar1 + local_940) * 4 + 3) + 0xc));
        PixelBufferAccess::setPixel(dst,(IVec4 *)&j_1,local_940,local_93c,0);
      }
    }
  }
  else {
    for (local_954 = 0; local_954 < iVar2; local_954 = local_954 + 1) {
      for (local_958 = 0; local_958 < iVar1; local_958 = local_958 + 1) {
        Vector<float,_4>::Vector
                  (&local_968,
                   *(float *)((long)blockData.m_words +
                             (long)((local_954 * iVar1 + local_958) * 4) * 4 + 0xc),
                   *(float *)((long)blockData.m_words +
                             (long)((local_954 * iVar1 + local_958) * 4 + 1) * 4 + 0xc),
                   *(float *)((long)blockData.m_words +
                             (long)((local_954 * iVar1 + local_958) * 4 + 2) * 4 + 0xc),
                   *(float *)((long)blockData.m_words +
                             (long)((local_954 * iVar1 + local_958) * 4 + 3) * 4 + 0xc));
        PixelBufferAccess::setPixel(dst,&local_968,local_958,local_954,0);
      }
    }
  }
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, const deUint8* data, bool isSRGB, bool isLDR)
{
	DE_ASSERT(isLDR || !isSRGB);

	const int blockWidth = dst.getWidth();
	const int blockHeight = dst.getHeight();

	union
	{
		deUint8		sRGB[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
		float		linear[MAX_BLOCK_WIDTH*MAX_BLOCK_HEIGHT*4];
	} decompressedBuffer;

	const Block128 blockData(data);
	decompressBlock(isSRGB ? (void*)&decompressedBuffer.sRGB[0] : (void*)&decompressedBuffer.linear[0],
					blockData, dst.getWidth(), dst.getHeight(), isSRGB, isLDR);

	if (isSRGB)
	{
		for (int i = 0; i < blockHeight; i++)
		for (int j = 0; j < blockWidth; j++)
		{
			dst.setPixel(IVec4(decompressedBuffer.sRGB[(i*blockWidth + j) * 4 + 0],
							   decompressedBuffer.sRGB[(i*blockWidth + j) * 4 + 1],
							   decompressedBuffer.sRGB[(i*blockWidth + j) * 4 + 2],
							   decompressedBuffer.sRGB[(i*blockWidth + j) * 4 + 3]), j, i);
		}
	}
	else
	{
		for (int i = 0; i < blockHeight; i++)
		for (int j = 0; j < blockWidth; j++)
		{
			dst.setPixel(Vec4(decompressedBuffer.linear[(i*blockWidth + j) * 4 + 0],
							  decompressedBuffer.linear[(i*blockWidth + j) * 4 + 1],
							  decompressedBuffer.linear[(i*blockWidth + j) * 4 + 2],
							  decompressedBuffer.linear[(i*blockWidth + j) * 4 + 3]), j, i);
		}
	}
}